

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path)

{
  int iVar1;
  UninterpretedOption *pUVar2;
  void *pvVar3;
  DescriptorBuilder *pDVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  bool bVar6;
  const_iterator cVar7;
  iterator intermediate_fields_end;
  vector<int,_std::allocator<int>_> *__k;
  bool bVar8;
  int iVar9;
  LogMessage *pLVar10;
  undefined4 extraout_var;
  Symbol SVar11;
  undefined4 extraout_var_00;
  Type *pTVar12;
  long *plVar13;
  undefined8 *puVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  UnknownFieldSet *pUVar16;
  string *target;
  mapped_type *pmVar17;
  mapped_type *this_00;
  code *pcVar18;
  Reflection *this_01;
  Reflection *this_02;
  undefined8 uVar19;
  ulong uVar20;
  DescriptorBuilder *pDVar21;
  _Alloc_hider _Var22;
  ConstStringParam key;
  FieldDescriptor *field;
  CodedOutputStream out;
  StringOutputStream outstr;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  vector<int,_std::allocator<int>_> dest_path;
  string debug_msg_name;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  parent_unknown_fields;
  size_type __dnew_1;
  size_type __dnew;
  int local_244;
  DescriptorBuilder *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  undefined1 local_230 [64];
  uint8_t *local_1f0;
  Message *local_1e0;
  undefined1 local_1d8 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  long local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  vector<int,_std::allocator<int>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  const_iterator local_108;
  iterator iStack_100;
  FieldDescriptor **local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  ulong *local_c8;
  long local_c0;
  ulong local_b8 [2];
  vector<int,_std::allocator<int>_> *local_a8;
  uint8_t *local_a0 [7];
  uint8_t *local_68 [7];
  
  pUVar2 = this->uninterpreted_option_;
  local_244 = (pUVar2->name_).super_RepeatedPtrFieldBase.current_size_;
  local_1e0 = options;
  if (local_244 == 0) {
    local_230._0_8_ = local_230 + 0x10;
    local_68[0] = (uint8_t *)0x18;
    local_230._0_8_ = std::__cxx11::string::_M_create((ulong *)local_230,(ulong)local_68);
    local_230._16_8_ = local_68[0];
    builtin_strncpy((char *)local_230._0_8_,"Option must have a name.",0x18);
    local_230._8_8_ = local_68[0];
    *(char *)(local_230._0_8_ + (long)local_68[0]) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_230);
  }
  else {
    if (local_244 < 1) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar10 = internal::LogMessage::operator<<
                          ((LogMessage *)local_68,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=((LogFinisher *)local_230,pLVar10);
      internal::LogMessage::~LogMessage((LogMessage *)local_68);
    }
    iVar9 = std::__cxx11::string::compare
                      ((char *)(*(ulong *)((long)((pUVar2->name_).super_RepeatedPtrFieldBase.rep_)->
                                                 elements[0] + 0x18) & 0xfffffffffffffffe));
    if (iVar9 != 0) {
      pDVar21 = this->builder_;
      iVar9 = (*(local_1e0->super_MessageLite)._vptr_MessageLite[0x11])();
      SVar11 = FindSymbolNotEnforcingDeps
                         (pDVar21,(string *)(*(long *)(CONCAT44(extraout_var,iVar9) + 8) + 0x20),
                          true);
      local_240 = (DescriptorBuilder *)0x0;
      if ((SVar11.ptr_ != (SymbolBase *)0x0) && ((SVar11.ptr_)->symbol_type_ == '\x01')) {
        local_240 = (DescriptorBuilder *)SVar11;
      }
      if (local_240 == (DescriptorBuilder *)0x0) {
        iVar9 = (*(local_1e0->super_MessageLite)._vptr_MessageLite[0x11])();
        local_240 = (DescriptorBuilder *)CONCAT44(extraout_var_00,iVar9);
      }
      if (local_240 == (DescriptorBuilder *)0x0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1bb0);
        pLVar10 = internal::LogMessage::operator<<
                            ((LogMessage *)local_a0,"CHECK failed: options_descriptor: ");
        internal::LogFinisher::operator=((LogFinisher *)local_230,pLVar10);
        internal::LogMessage::~LogMessage((LogMessage *)local_a0);
      }
      local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      local_f8 = (FieldDescriptor **)0x0;
      local_108._M_current = (FieldDescriptor **)0x0;
      iStack_100._M_current = (FieldDescriptor **)0x0;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      local_128._M_string_length = 0;
      local_128.field_2._M_local_buf[0] = '\0';
      std::vector<int,_std::allocator<int>_>::vector(&local_140,options_path);
      iVar9 = (this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_;
      bVar8 = 0 < iVar9;
      local_a8 = src_path;
      if (0 < iVar9) {
        paVar5 = &local_1a0.field_2;
        iVar9 = 0;
        bVar8 = true;
        do {
          pDVar21 = this->builder_;
          (pDVar21->undefine_resolved_name_)._M_string_length = 0;
          *(pDVar21->undefine_resolved_name_)._M_dataplus._M_p = '\0';
          pTVar12 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                              (&(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase,
                               iVar9);
          pvVar3 = (pTVar12->name_part_).tagged_ptr_.ptr_;
          if (local_128._M_string_length != 0) {
            std::__cxx11::string::append((char *)&local_128);
          }
          pTVar12 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
                              (&(this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase,
                               iVar9);
          key = (ConstStringParam)((ulong)pvVar3 & 0xfffffffffffffffe);
          if (pTVar12->is_extension_ == true) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1d8,"(",key);
            plVar13 = (long *)std::__cxx11::string::append((char *)local_1d8);
            local_230._0_8_ = local_230 + 0x10;
            pcVar18 = (code *)(plVar13 + 2);
            if ((code *)*plVar13 == pcVar18) {
              local_230._16_8_ = *(undefined8 *)pcVar18;
              local_230._24_8_ = plVar13[3];
            }
            else {
              local_230._16_8_ = *(undefined8 *)pcVar18;
              local_230._0_8_ = (code *)*plVar13;
            }
            local_230._8_8_ = plVar13[1];
            *plVar13 = (long)pcVar18;
            plVar13[1] = 0;
            *(undefined1 *)(plVar13 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_128,local_230._0_8_);
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
              operator_delete((void *)local_230._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1d8 + 0x10)) {
              operator_delete((void *)local_1d8._0_8_);
            }
            pDVar21 = this->builder_;
            local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)LookupSymbol(pDVar21,key,&this->options_to_interpret_->name_scope,
                                        PLACEHOLDER_MESSAGE,LOOKUP_ALL,true);
            if ((local_238 ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0) || (((SymbolBase *)local_238)->symbol_type_ != '\x02')) {
              local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
            }
          }
          else {
            std::__cxx11::string::_M_append((char *)&local_128,(ulong)(key->_M_dataplus)._M_p);
            pDVar21 = local_240;
            local_238 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)Descriptor::FindFieldByName((Descriptor *)local_240,key);
          }
          if (local_238 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            if (this->builder_->pool_->allow_unknown_ != false) {
LAB_003646df:
              AddWithoutInterpreting
                        ((OptionInterpreter *)pDVar21,this->uninterpreted_option_,local_1e0);
              local_244 = 1;
              bVar6 = false;
              goto LAB_00364f4c;
            }
            if ((this->builder_->undefine_resolved_name_)._M_string_length != 0) {
              std::operator+(&local_e8,"Option \"",&local_128);
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_e8);
              local_180 = &local_170;
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 == paVar15) {
                local_170._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_170._8_8_ = plVar13[3];
              }
              else {
                local_170._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar13;
              }
              local_178 = plVar13[1];
              *plVar13 = (long)paVar15;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              puVar14 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_180,
                                   (ulong)(this->builder_->undefine_resolved_name_)._M_dataplus._M_p
                                  );
              local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 == paVar15) {
                local_160.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_160.field_2._8_8_ = puVar14[3];
              }
              else {
                local_160.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_160._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_160._M_string_length = puVar14[1];
              *puVar14 = paVar15;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 == paVar15) {
                local_1a0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_1a0.field_2._8_8_ = puVar14[3];
                local_1a0._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_1a0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_1a0._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_1a0._M_string_length = puVar14[1];
              *puVar14 = paVar15;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              std::__cxx11::string::substr((ulong)&local_c8,(ulong)&local_128);
              uVar19 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != paVar5) {
                uVar19 = local_1a0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar19 < local_1a0._M_string_length + local_c0) {
                uVar20 = 0xf;
                if (local_c8 != local_b8) {
                  uVar20 = local_b8[0];
                }
                if (uVar20 < local_1a0._M_string_length + local_c0) goto LAB_00364bfa;
                puVar14 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_c8,0,(char *)0x0,
                                     (ulong)local_1a0._M_dataplus._M_p);
              }
              else {
LAB_00364bfa:
                puVar14 = (undefined8 *)
                          std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_c8);
              }
              local_1d8._0_8_ = local_1d8 + 0x10;
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 == paVar15) {
                local_1d8._16_8_ = paVar15->_M_allocated_capacity;
                local_1d8._24_8_ = puVar14[3];
              }
              else {
                local_1d8._16_8_ = paVar15->_M_allocated_capacity;
                local_1d8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar14;
              }
              local_1d8._8_8_ = puVar14[1];
              *puVar14 = paVar15;
              puVar14[1] = 0;
              paVar15->_M_local_buf[0] = '\0';
              puVar14 = (undefined8 *)std::__cxx11::string::append(local_1d8);
              local_230._0_8_ = local_230 + 0x10;
              pcVar18 = (code *)(puVar14 + 2);
              if ((code *)*puVar14 == pcVar18) {
                local_230._16_8_ = *(undefined8 *)pcVar18;
                local_230._24_8_ = puVar14[3];
              }
              else {
                local_230._16_8_ = *(undefined8 *)pcVar18;
                local_230._0_8_ = (code *)*puVar14;
              }
              local_230._8_8_ = puVar14[1];
              *puVar14 = pcVar18;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              AddError(this->builder_,&this->options_to_interpret_->element_name,
                       &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_230);
              if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
                operator_delete((void *)local_230._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1d8 + 0x10)) {
                operator_delete((void *)local_1d8._0_8_);
              }
              if (local_c8 != local_b8) {
                operator_delete(local_c8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != paVar5) {
                operator_delete(local_1a0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p);
              }
              if (local_180 != &local_170) {
                operator_delete(local_180);
              }
              paVar15 = &local_e8.field_2;
              _Var22._M_p = local_e8._M_dataplus._M_p;
              goto LAB_00364f3d;
            }
            std::operator+(&local_1a0,"Option \"",&local_128);
            puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a0);
            local_1d8._0_8_ = local_1d8 + 0x10;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar14 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 == paVar15) {
              local_1d8._16_8_ = paVar15->_M_allocated_capacity;
              local_1d8._24_8_ = puVar14[3];
            }
            else {
              local_1d8._16_8_ = paVar15->_M_allocated_capacity;
              local_1d8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar14;
            }
            local_1d8._8_8_ = puVar14[1];
            *puVar14 = paVar15;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            puVar14 = (undefined8 *)std::__cxx11::string::append(local_1d8);
            local_230._0_8_ = local_230 + 0x10;
            pcVar18 = (code *)(puVar14 + 2);
            if ((code *)*puVar14 == pcVar18) {
              local_230._16_8_ = *(undefined8 *)pcVar18;
              local_230._24_8_ = puVar14[3];
            }
            else {
              local_230._16_8_ = *(undefined8 *)pcVar18;
              local_230._0_8_ = (code *)*puVar14;
            }
            local_230._8_8_ = puVar14[1];
            *puVar14 = pcVar18;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            AddError(this->builder_,&this->options_to_interpret_->element_name,
                     &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_230);
            if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
              operator_delete((void *)local_230._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1d8 + 0x10)) {
              operator_delete((void *)local_1d8._0_8_);
            }
            _Var22._M_p = local_1a0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != paVar5) goto LAB_00364f42;
LAB_00364f47:
            bVar6 = false;
            local_244 = 0;
          }
          else {
            pDVar4 = *(DescriptorBuilder **)(local_238->_M_local_buf + 0x20);
            if (pDVar4 != local_240) {
              if ((pDVar4 != (DescriptorBuilder *)0x0) && (((ulong)pDVar4->pool_ & 0x100) != 0))
              goto LAB_003646df;
              std::operator+(&local_160,"Option field \"",&local_128);
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_160);
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 == paVar15) {
                local_1a0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_1a0.field_2._8_8_ = puVar14[3];
                local_1a0._M_dataplus._M_p = (pointer)paVar5;
              }
              else {
                local_1a0.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_1a0._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_1a0._M_string_length = puVar14[1];
              *puVar14 = paVar15;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              puVar14 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_1a0,
                                   (ulong)(local_240->tables_->pending_files_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
              local_1d8._0_8_ = local_1d8 + 0x10;
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar14 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 == paVar15) {
                local_1d8._16_8_ = paVar15->_M_allocated_capacity;
                local_1d8._24_8_ = puVar14[3];
              }
              else {
                local_1d8._16_8_ = paVar15->_M_allocated_capacity;
                local_1d8._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar14;
              }
              local_1d8._8_8_ = puVar14[1];
              *puVar14 = paVar15;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              puVar14 = (undefined8 *)std::__cxx11::string::append(local_1d8);
              local_230._0_8_ = local_230 + 0x10;
              pcVar18 = (code *)(puVar14 + 2);
              if ((code *)*puVar14 == pcVar18) {
                local_230._16_8_ = *(undefined8 *)pcVar18;
                local_230._24_8_ = puVar14[3];
              }
              else {
                local_230._16_8_ = *(undefined8 *)pcVar18;
                local_230._0_8_ = (code *)*puVar14;
              }
              local_230._8_8_ = puVar14[1];
              *puVar14 = pcVar18;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              AddError(this->builder_,&this->options_to_interpret_->element_name,
                       &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_230);
              if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
                operator_delete((void *)local_230._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1d8 + 0x10)) {
                operator_delete((void *)local_1d8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != paVar5) {
                operator_delete(local_1a0._M_dataplus._M_p);
              }
              paVar15 = &local_160.field_2;
              _Var22._M_p = local_160._M_dataplus._M_p;
LAB_00364f3d:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var22._M_p != paVar15) {
LAB_00364f42:
                operator_delete(_Var22._M_p);
              }
              goto LAB_00364f47;
            }
            local_230._0_4_ = *(int *)(local_238->_M_local_buf + 4);
            if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_140,
                         (iterator)
                         local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)local_230);
            }
            else {
              *local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = *(int *)(local_238->_M_local_buf + 4);
              local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            paVar15 = local_238;
            bVar6 = true;
            if (iVar9 < (this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.
                        current_size_ + -1) {
              if (*(once_flag **)(local_238->_M_local_buf + 0x18) != (once_flag *)0x0) {
                local_230._0_8_ = FieldDescriptor::TypeOnceInit;
                local_1d8._0_8_ = local_238;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (*(once_flag **)(local_238->_M_local_buf + 0x18),
                           (_func_void_FieldDescriptor_ptr **)local_230,
                           (FieldDescriptor **)local_1d8);
              }
              if (((byte)*(FieldDescriptor *)(paVar15->_M_local_buf + 2) & 0xfe) == 10) {
                if ((~(byte)*(FieldDescriptor *)(local_238->_M_local_buf + 1) & 0x60) != 0) {
                  if (iStack_100._M_current == local_f8) {
                    std::
                    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                                *)&local_108,iStack_100,(FieldDescriptor **)&local_238);
                  }
                  else {
                    *iStack_100._M_current = (FieldDescriptor *)local_238;
                    iStack_100._M_current = iStack_100._M_current + 1;
                  }
                  local_240 = (DescriptorBuilder *)
                              FieldDescriptor::message_type
                                        ((FieldDescriptor *)local_238->_M_local_buf);
                  goto LAB_00364f4c;
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1d8,"Option field \"",&local_128);
                puVar14 = (undefined8 *)std::__cxx11::string::append((char *)local_1d8);
                local_230._0_8_ = local_230 + 0x10;
                pcVar18 = (code *)(puVar14 + 2);
                if ((code *)*puVar14 == pcVar18) {
                  local_230._16_8_ = *(undefined8 *)pcVar18;
                  local_230._24_8_ = puVar14[3];
                }
                else {
                  local_230._16_8_ = *(undefined8 *)pcVar18;
                  local_230._0_8_ = (code *)*puVar14;
                }
                local_230._8_8_ = puVar14[1];
                *puVar14 = pcVar18;
                puVar14[1] = 0;
                *(undefined1 *)(puVar14 + 2) = 0;
                AddError(this->builder_,&this->options_to_interpret_->element_name,
                         &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_230
                        );
              }
              else {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1d8,"Option \"",&local_128);
                puVar14 = (undefined8 *)std::__cxx11::string::append((char *)local_1d8);
                local_230._0_8_ = local_230 + 0x10;
                pcVar18 = (code *)(puVar14 + 2);
                if ((code *)*puVar14 == pcVar18) {
                  local_230._16_8_ = *(undefined8 *)pcVar18;
                  local_230._24_8_ = puVar14[3];
                }
                else {
                  local_230._16_8_ = *(undefined8 *)pcVar18;
                  local_230._0_8_ = (code *)*puVar14;
                }
                local_230._8_8_ = puVar14[1];
                *puVar14 = pcVar18;
                puVar14[1] = 0;
                *(undefined1 *)(puVar14 + 2) = 0;
                AddError(this->builder_,&this->options_to_interpret_->element_name,
                         &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_230
                        );
              }
              if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
                operator_delete((void *)local_230._0_8_);
              }
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_1d8 + 0x10);
              _Var22._M_p = (pointer)local_1d8._0_8_;
              goto LAB_00364f3d;
            }
          }
LAB_00364f4c:
          if (!bVar6) break;
          iVar9 = iVar9 + 1;
          iVar1 = (this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_;
          bVar8 = iVar9 < iVar1;
        } while (iVar9 < iVar1);
      }
      intermediate_fields_end._M_current = iStack_100._M_current;
      cVar7._M_current = local_108._M_current;
      paVar5 = local_238;
      if (!bVar8) {
        if ((~local_238->_M_local_buf[1] & 0x60U) != 0) {
          (*(local_1e0->super_MessageLite)._vptr_MessageLite[0x11])();
          pUVar16 = Reflection::GetUnknownFields(this_01,local_1e0);
          bVar8 = ExamineIfOptionIsSet
                            (this,cVar7,(const_iterator)intermediate_fields_end._M_current,
                             (FieldDescriptor *)paVar5->_M_local_buf,&local_128,pUVar16);
          if (!bVar8) {
            local_244._0_1_ = 0;
            goto LAB_003654c5;
          }
        }
        local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)operator_new(0x18);
        local_180->_M_allocated_capacity = 0;
        *(undefined8 *)(local_180->_M_local_buf + 8) = 0;
        *(undefined8 *)(local_180->_M_local_buf + 0x10) = 0;
        bVar8 = SetOptionValue(this,(FieldDescriptor *)local_238->_M_local_buf,
                               (UnknownFieldSet *)local_180);
        if (bVar8) {
          local_240 = (DescriptorBuilder *)iStack_100._M_current;
          pDVar21 = local_240;
          do {
            local_240 = pDVar21;
            cVar7._M_current = local_108._M_current;
            if (local_240 == (DescriptorBuilder *)local_108._M_current) break;
            local_e8._M_dataplus._M_p = (pointer)operator_new(0x18);
            *(size_type *)local_e8._M_dataplus._M_p = 0;
            *(undefined8 *)(local_e8._M_dataplus._M_p + 8) = 0;
            *(undefined8 *)(local_e8._M_dataplus._M_p + 0x10) = 0;
            paVar5 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       **)((long)local_240 + -8);
            if (*(once_flag **)(paVar5->_M_local_buf + 0x18) != (once_flag *)0x0) {
              local_230._0_8_ = FieldDescriptor::TypeOnceInit;
              local_1a0._M_dataplus._M_p = (pointer)paVar5;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(paVar5->_M_local_buf + 0x18),
                         (_func_void_FieldDescriptor_ptr **)local_230,(FieldDescriptor **)&local_1a0
                        );
            }
            pDVar21 = (DescriptorBuilder *)((long)local_240 + -8);
            if (*(FieldDescriptor *)(paVar5->_M_local_buf + 2) == (FieldDescriptor)0xa) {
              pUVar16 = UnknownFieldSet::AddGroup
                                  ((UnknownFieldSet *)local_e8._M_dataplus._M_p,
                                   *(int *)(*(FieldDescriptor **)pDVar21 + 4));
              UnknownFieldSet::MergeFrom(pUVar16,(UnknownFieldSet *)local_180);
LAB_003652df:
              _Var22._M_p = local_e8._M_dataplus._M_p;
              paVar5 = local_180;
              local_e8._M_dataplus._M_p = (pointer)0x0;
              local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_Var22._M_p;
              bVar8 = true;
              if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)0x0) {
                std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                          ((default_delete<google::protobuf::UnknownFieldSet> *)&local_180,
                           (UnknownFieldSet *)paVar5);
              }
            }
            else {
              if (*(FieldDescriptor *)(paVar5->_M_local_buf + 2) == (FieldDescriptor)0xb) {
                target = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                                   ((UnknownFieldSet *)local_e8._M_dataplus._M_p,
                                    *(int *)(*(FieldDescriptor **)pDVar21 + 4));
                io::StringOutputStream::StringOutputStream((StringOutputStream *)&local_1a0,target);
                io::CodedOutputStream::CodedOutputStream
                          ((CodedOutputStream *)local_230,(ZeroCopyOutputStream *)&local_1a0,true);
                local_1f0 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                                      ((UnknownFieldSet *)local_180,local_1f0,
                                       (EpsCopyOutputStream *)local_230);
                bVar8 = io::CodedOutputStream::HadError((CodedOutputStream *)local_230);
                if (bVar8) {
                  internal::LogMessage::LogMessage
                            ((LogMessage *)local_1d8,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                             ,0x1c39);
                  pLVar10 = internal::LogMessage::operator<<
                                      ((LogMessage *)local_1d8,"CHECK failed: !out.HadError(): ");
                  pLVar10 = internal::LogMessage::operator<<
                                      (pLVar10,
                                       "Unexpected failure while serializing option submessage ");
                  pLVar10 = internal::LogMessage::operator<<(pLVar10,&local_128);
                  pLVar10 = internal::LogMessage::operator<<(pLVar10,"\".");
                  internal::LogFinisher::operator=((LogFinisher *)&local_160,pLVar10);
                  if (bVar8) {
                    internal::LogMessage::~LogMessage((LogMessage *)local_1d8);
                  }
                }
                io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_230);
                goto LAB_003652df;
              }
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_230,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                         ,0x1c46);
              pLVar10 = internal::LogMessage::operator<<
                                  ((LogMessage *)local_230,"Invalid wire type for CPPTYPE_MESSAGE: "
                                  );
              paVar5 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         **)pDVar21;
              if (*(once_flag **)(paVar5->_M_local_buf + 0x18) != (once_flag *)0x0) {
                local_1a0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
                local_160._M_dataplus._M_p = (pointer)paVar5;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (*(once_flag **)(paVar5->_M_local_buf + 0x18),
                           (_func_void_FieldDescriptor_ptr **)&local_1a0,
                           (FieldDescriptor **)&local_160);
              }
              pLVar10 = internal::LogMessage::operator<<
                                  (pLVar10,(uint)(byte)*(FieldDescriptor *)
                                                        (paVar5->_M_local_buf + 2));
              internal::LogFinisher::operator=((LogFinisher *)&local_1a0,pLVar10);
              internal::LogMessage::~LogMessage((LogMessage *)local_230);
              bVar8 = false;
              local_244 = 0;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                        ((default_delete<google::protobuf::UnknownFieldSet> *)&local_e8,
                         (UnknownFieldSet *)local_e8._M_dataplus._M_p);
            }
          } while (bVar8);
          __k = local_a8;
          if (local_240 == (DescriptorBuilder *)cVar7._M_current) {
            (*(local_1e0->super_MessageLite)._vptr_MessageLite[0x11])();
            pUVar16 = Reflection::MutableUnknownFields(this_02,local_1e0);
            UnknownFieldSet::MergeFrom(pUVar16,(UnknownFieldSet *)local_180);
            if ((~local_238->_M_local_buf[1] & 0x60U) == 0) {
              pmVar17 = std::
                        map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                        ::operator[](&this->repeated_option_counts_,&local_140);
              iVar9 = *pmVar17;
              *pmVar17 = iVar9 + 1;
              local_230._0_4_ = iVar9;
              if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_140,
                           (iterator)
                           local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)local_230);
              }
              else {
                *local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = iVar9;
                local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            this_00 = std::
                      map<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](&this->interpreted_paths_,__k);
            local_244._0_1_ = 1;
            std::vector<int,_std::allocator<int>_>::operator=(this_00,&local_140);
          }
        }
        else {
          local_244._0_1_ = 0;
        }
        if (local_180 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                    ((default_delete<google::protobuf::UnknownFieldSet> *)&local_180,
                     (UnknownFieldSet *)local_180);
        }
      }
LAB_003654c5:
      if (local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_140.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
      if (local_108._M_current != (FieldDescriptor **)0x0) {
        operator_delete(local_108._M_current);
      }
      goto LAB_00365503;
    }
    local_230._0_8_ = local_230 + 0x10;
    local_a0[0] = (uint8_t *)0x39;
    local_230._0_8_ = std::__cxx11::string::_M_create((ulong *)local_230,(ulong)local_a0);
    local_230._16_8_ = local_a0[0];
    builtin_strncpy((char *)local_230._0_8_,
                    "Option must not use reserved name \"uninterpreted_option\".",0x39);
    local_230._8_8_ = local_a0[0];
    *(char *)(local_230._0_8_ + (long)local_a0[0]) = '\0';
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_230);
  }
  if ((undefined1 *)local_230._0_8_ != local_230 + 0x10) {
    operator_delete((void *)local_230._0_8_);
  }
  local_244._0_1_ = 0;
LAB_00365503:
  return (bool)((byte)local_244 & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError(
        "Option must not use reserved name "
        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  options_descriptor = symbol.descriptor();
  if (options_descriptor == nullptr) {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    builder_->undefine_resolved_name_.clear();
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      field = symbol.field_descriptor();
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError(
            "Option \"" + debug_msg_name + "\" is resolved to \"(" +
            builder_->undefine_resolved_name_ +
            ")\", which is not defined. The innermost scope is searched first "
            "in name resolution. Consider using a leading '.'(i.e., \"(." +
            debug_msg_name.substr(1) +
            "\") to start from the outermost scope.");
      } else {
        return AddNameError(
            "Option \"" + debug_msg_name +
            "\" unknown. Ensure that your proto" +
            " definition file imports the proto which defines the option.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError("Option \"" + debug_msg_name +
                              "\" is an atomic type, not a message.");
        } else if (field->is_repeated()) {
          return AddNameError("Option field \"" + debug_msg_name +
                              "\" is a repeated message. Repeated message "
                              "options must be initialized using an "
                              "aggregate value.");
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}